

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void * __thiscall tetgenmesh::memorypool::alloc(memorypool *this)

{
  int iVar1;
  undefined8 *puVar2;
  void **ppvVar3;
  void **ppvVar4;
  
  puVar2 = (undefined8 *)this->deaditemstack;
  if (puVar2 == (undefined8 *)0x0) {
    iVar1 = this->unallocateditems;
    if (iVar1 == 0) {
      ppvVar4 = this->nowblock;
      ppvVar3 = (void **)*ppvVar4;
      if (ppvVar3 == (void **)0x0) {
        puVar2 = (undefined8 *)
                 malloc((long)this->itembytes * (long)this->itemsperblock + (long)this->alignbytes +
                        8);
        if (puVar2 == (undefined8 *)0x0) {
          terminatetetgen((tetgenmesh *)0x0,1);
          ppvVar4 = this->nowblock;
        }
        *ppvVar4 = puVar2;
        *puVar2 = 0;
        ppvVar3 = (void **)*this->nowblock;
      }
      this->nowblock = ppvVar3;
      puVar2 = (undefined8 *)
               ((long)ppvVar3 +
               (((long)this->alignbytes + 8U) - (ulong)(ppvVar3 + 1) % (ulong)(long)this->alignbytes
               ));
      iVar1 = this->itemsperblock;
    }
    else {
      puVar2 = (undefined8 *)this->nextitem;
    }
    this->nextitem = (void *)((long)this->itembytes + (long)puVar2);
    this->unallocateditems = iVar1 + -1;
    this->maxitems = this->maxitems + 1;
  }
  else {
    this->deaditemstack = (void *)*puVar2;
  }
  this->items = this->items + 1;
  return puVar2;
}

Assistant:

void* tetgenmesh::memorypool::alloc()
{
  void *newitem;
  void **newblock;
  uintptr_t alignptr;

  // First check the linked list of dead items.  If the list is not 
  //   empty, allocate an item from the list rather than a fresh one.
  if (deaditemstack != (void *) NULL) {
    newitem = deaditemstack;                     // Take first item in list.
    deaditemstack = * (void **) deaditemstack;
  } else {
    // Check if there are any free items left in the current block.
    if (unallocateditems == 0) {
      // Check if another block must be allocated.
      if (*nowblock == (void *) NULL) {
        // Allocate a new block of items, pointed to by the previous block.
        newblock = (void **) malloc(itemsperblock * itembytes + sizeof(void *) 
                                    + alignbytes);
        if (newblock == (void **) NULL) {
          terminatetetgen(NULL, 1);
        }
        *nowblock = (void *) newblock;
        // The next block pointer is NULL.
        *newblock = (void *) NULL;
      }
      // Move to the new block.
      nowblock = (void **) *nowblock;
      // Find the first item in the block.
      //   Increment by the size of (void *).
      alignptr = (uintptr_t) (nowblock + 1);
      // Align the item on an `alignbytes'-byte boundary.
      nextitem = (void *)
        (alignptr + (uintptr_t) alignbytes -
         (alignptr % (uintptr_t) alignbytes));
      // There are lots of unallocated items left in this block.
      unallocateditems = itemsperblock;
    }
    // Allocate a new item.
    newitem = nextitem;
    // Advance `nextitem' pointer to next free item in block.
    nextitem = (void *) ((uintptr_t) nextitem + itembytes);
    unallocateditems--;
    maxitems++;
  }
  items++;
  return newitem;
}